

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

CURLcode Curl_http_input_auth(Curl_easy *data,_Bool proxy,char *auth)

{
  undefined1 *puVar1;
  char *pcVar2;
  long lVar3;
  byte *pbVar4;
  byte bVar5;
  long lVar6;
  char cVar7;
  _Bool _Var8;
  int iVar9;
  CURLcode CVar10;
  ulong uVar11;
  undefined7 in_register_00000031;
  ulong uVar12;
  
  uVar12 = (ulong)(uint)((int)CONCAT71(in_register_00000031,proxy) << 5) | 0xdc0;
  lVar3 = (ulong)!proxy * 8;
  cVar7 = *auth;
  do {
    if (cVar7 == '\0') {
      return CURLE_OK;
    }
    iVar9 = curl_strnequal(auth,"NTLM",4);
    if (iVar9 == 0) {
LAB_00461879:
      iVar9 = curl_strnequal(auth,"Digest",6);
      if (iVar9 != 0) {
        bVar5 = auth[6];
        if ((((ulong)bVar5 < 0x2d) && ((0x100100000201U >> ((ulong)bVar5 & 0x3f) & 1) != 0)) ||
           (0xfb < (byte)(bVar5 - 0xe))) {
          if ((*(byte *)((long)data->sockets + (uVar12 - 0x78)) & 2) == 0) {
            _Var8 = Curl_auth_is_digest_supported();
            if (_Var8) {
              pcVar2 = (data->info).conn_primary_ip + lVar3 + -0x30;
              *pcVar2 = *pcVar2 | 2;
              pbVar4 = (byte *)((long)data->sockets + (uVar12 - 0x78));
              *pbVar4 = *pbVar4 | 2;
              CVar10 = Curl_input_digest(data,proxy,auth);
              if (CVar10 != CURLE_OK) goto LAB_00461995;
            }
          }
          else {
            Curl_infof(data,"Ignoring duplicate digest auth header.");
          }
          goto LAB_004619bb;
        }
      }
      iVar9 = curl_strnequal(auth,"Basic",5);
      if (iVar9 != 0) {
        bVar5 = auth[5];
        if (((0x2c < (ulong)bVar5) || ((0x100100000201U >> ((ulong)bVar5 & 0x3f) & 1) == 0)) &&
           ((byte)(bVar5 - 0xe) < 0xfc)) goto LAB_0046194c;
        pcVar2 = (data->info).conn_primary_ip + lVar3 + -0x30;
        *pcVar2 = *pcVar2 | 1;
        pbVar4 = (byte *)((long)data->sockets + (uVar12 - 0x78));
        *pbVar4 = *pbVar4 | 1;
        if (*(long *)((long)data->sockets + (uVar12 - 0x80)) != 1) goto LAB_004619bb;
LAB_0046198f:
        *(undefined8 *)((long)data->sockets + (uVar12 - 0x78)) = 0;
        goto LAB_00461995;
      }
LAB_0046194c:
      iVar9 = curl_strnequal(auth,"Bearer",6);
      if (iVar9 != 0) {
        bVar5 = auth[6];
        if ((((ulong)bVar5 < 0x2d) && ((0x100100000201U >> ((ulong)bVar5 & 0x3f) & 1) != 0)) ||
           (0xfb < (byte)(bVar5 - 0xe))) {
          pcVar2 = (data->info).conn_primary_ip + lVar3 + -0x30;
          *pcVar2 = *pcVar2 | 0x40;
          pbVar4 = (byte *)((long)data->sockets + (uVar12 - 0x78));
          *pbVar4 = *pbVar4 | 0x40;
          if (*(long *)((long)data->sockets + (uVar12 - 0x80)) == 0x40) goto LAB_0046198f;
        }
      }
    }
    else {
      bVar5 = auth[4];
      if (((0x2c < (ulong)bVar5) || ((0x100100000201U >> ((ulong)bVar5 & 0x3f) & 1) == 0)) &&
         ((byte)(bVar5 - 0xe) < 0xfc)) goto LAB_00461879;
      uVar11 = *(ulong *)((long)data->sockets + (uVar12 - 0x78));
      if ((uVar11 & 0x28) == 0) {
        _Var8 = Curl_auth_is_ntlm_supported();
        if (_Var8) {
          uVar11 = *(ulong *)((long)data->sockets + (uVar12 - 0x78));
          goto LAB_0046182c;
        }
        goto LAB_004619bb;
      }
LAB_0046182c:
      pcVar2 = (data->info).conn_primary_ip + lVar3 + -0x30;
      *pcVar2 = *pcVar2 | 8;
      *(ulong *)((long)data->sockets + (uVar12 - 0x78)) = uVar11 | 8;
      lVar6 = *(long *)((long)data->sockets + (uVar12 - 0x80));
      if ((lVar6 != 0x20) && (lVar6 != 8)) goto LAB_004619bb;
      CVar10 = Curl_input_ntlm(data,proxy,auth);
      if (CVar10 == CURLE_OK) {
        puVar1 = &(data->state).field_0x6d0;
        *puVar1 = *puVar1 & 0xdf;
        goto LAB_004619bb;
      }
LAB_00461995:
      Curl_infof(data,"Authentication problem. Ignoring this.");
      puVar1 = &(data->state).field_0x6d0;
      *puVar1 = *puVar1 | 0x20;
    }
LAB_004619bb:
    for (; (cVar7 = *auth, cVar7 != '\0' && (cVar7 != ',')); auth = auth + 1) {
    }
    for (auth = auth + (cVar7 == ',');
        ((cVar7 = *auth, cVar7 == '\t' || (cVar7 == ' ')) ||
        ((cVar7 != '\0' && ((byte)(cVar7 - 10U) < 4)))); auth = auth + 1) {
    }
  } while( true );
}

Assistant:

CURLcode Curl_http_input_auth(struct Curl_easy *data, bool proxy,
                              const char *auth) /* the first non-space */
{
  /*
   * This resource requires authentication
   */
  struct connectdata *conn = data->conn;
#ifdef USE_SPNEGO
  curlnegotiate *negstate = proxy ? &conn->proxy_negotiate_state :
                                    &conn->http_negotiate_state;
#endif
  unsigned long *availp;
  struct auth *authp;

  (void) conn; /* In case conditionals make it unused. */

  if(proxy) {
    availp = &data->info.proxyauthavail;
    authp = &data->state.authproxy;
  }
  else {
    availp = &data->info.httpauthavail;
    authp = &data->state.authhost;
  }

  /*
   * Here we check if we want the specific single authentication (using ==) and
   * if we do, we initiate usage of it.
   *
   * If the provided authentication is wanted as one out of several accepted
   * types (using &), we OR this authentication type to the authavail
   * variable.
   *
   * Note:
   *
   * ->picked is first set to the 'want' value (one or more bits) before the
   * request is sent, and then it is again set _after_ all response 401/407
   * headers have been received but then only to a single preferred method
   * (bit).
   */

  while(*auth) {
#ifdef USE_SPNEGO
    if(checkprefix("Negotiate", auth) && is_valid_auth_separator(auth[9])) {
      if((authp->avail & CURLAUTH_NEGOTIATE) ||
         Curl_auth_is_spnego_supported()) {
        *availp |= CURLAUTH_NEGOTIATE;
        authp->avail |= CURLAUTH_NEGOTIATE;

        if(authp->picked == CURLAUTH_NEGOTIATE) {
          CURLcode result = Curl_input_negotiate(data, conn, proxy, auth);
          if(!result) {
            DEBUGASSERT(!data->req.newurl);
            data->req.newurl = strdup(data->state.url);
            if(!data->req.newurl)
              return CURLE_OUT_OF_MEMORY;
            data->state.authproblem = FALSE;
            /* we received a GSS auth token and we dealt with it fine */
            *negstate = GSS_AUTHRECV;
          }
          else
            data->state.authproblem = TRUE;
        }
      }
    }
    else
#endif
#ifdef USE_NTLM
      /* NTLM support requires the SSL crypto libs */
      if(checkprefix("NTLM", auth) && is_valid_auth_separator(auth[4])) {
        if((authp->avail & CURLAUTH_NTLM) ||
           (authp->avail & CURLAUTH_NTLM_WB) ||
           Curl_auth_is_ntlm_supported()) {
          *availp |= CURLAUTH_NTLM;
          authp->avail |= CURLAUTH_NTLM;

          if(authp->picked == CURLAUTH_NTLM ||
             authp->picked == CURLAUTH_NTLM_WB) {
            /* NTLM authentication is picked and activated */
            CURLcode result = Curl_input_ntlm(data, proxy, auth);
            if(!result) {
              data->state.authproblem = FALSE;
#ifdef NTLM_WB_ENABLED
              if(authp->picked == CURLAUTH_NTLM_WB) {
                *availp &= ~CURLAUTH_NTLM;
                authp->avail &= ~CURLAUTH_NTLM;
                *availp |= CURLAUTH_NTLM_WB;
                authp->avail |= CURLAUTH_NTLM_WB;

                result = Curl_input_ntlm_wb(data, conn, proxy, auth);
                if(result) {
                  infof(data, "Authentication problem. Ignoring this.");
                  data->state.authproblem = TRUE;
                }
              }
#endif
            }
            else {
              infof(data, "Authentication problem. Ignoring this.");
              data->state.authproblem = TRUE;
            }
          }
        }
      }
      else
#endif
#ifndef CURL_DISABLE_CRYPTO_AUTH
        if(checkprefix("Digest", auth) && is_valid_auth_separator(auth[6])) {
          if((authp->avail & CURLAUTH_DIGEST) != 0)
            infof(data, "Ignoring duplicate digest auth header.");
          else if(Curl_auth_is_digest_supported()) {
            CURLcode result;

            *availp |= CURLAUTH_DIGEST;
            authp->avail |= CURLAUTH_DIGEST;

            /* We call this function on input Digest headers even if Digest
             * authentication isn't activated yet, as we need to store the
             * incoming data from this header in case we are going to use
             * Digest */
            result = Curl_input_digest(data, proxy, auth);
            if(result) {
              infof(data, "Authentication problem. Ignoring this.");
              data->state.authproblem = TRUE;
            }
          }
        }
        else
#endif
          if(checkprefix("Basic", auth) &&
             is_valid_auth_separator(auth[5])) {
            *availp |= CURLAUTH_BASIC;
            authp->avail |= CURLAUTH_BASIC;
            if(authp->picked == CURLAUTH_BASIC) {
              /* We asked for Basic authentication but got a 40X back
                 anyway, which basically means our name+password isn't
                 valid. */
              authp->avail = CURLAUTH_NONE;
              infof(data, "Authentication problem. Ignoring this.");
              data->state.authproblem = TRUE;
            }
          }
          else
            if(checkprefix("Bearer", auth) &&
               is_valid_auth_separator(auth[6])) {
              *availp |= CURLAUTH_BEARER;
              authp->avail |= CURLAUTH_BEARER;
              if(authp->picked == CURLAUTH_BEARER) {
                /* We asked for Bearer authentication but got a 40X back
                  anyway, which basically means our token isn't valid. */
                authp->avail = CURLAUTH_NONE;
                infof(data, "Authentication problem. Ignoring this.");
                data->state.authproblem = TRUE;
              }
            }

    /* there may be multiple methods on one line, so keep reading */
    while(*auth && *auth != ',') /* read up to the next comma */
      auth++;
    if(*auth == ',') /* if we're on a comma, skip it */
      auth++;
    while(*auth && ISSPACE(*auth))
      auth++;
  }

  return CURLE_OK;
}